

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

char * __thiscall cmMakefile::GetSONameFlag(cmMakefile *this,string *language)

{
  char *pcVar1;
  string name;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"CMAKE_SHARED_LIBRARY_SONAME","");
  if (language->_M_string_length != 0) {
    std::__cxx11::string::append((char *)&local_38);
    std::__cxx11::string::_M_append((char *)&local_38,(ulong)(language->_M_dataplus)._M_p);
  }
  std::__cxx11::string::append((char *)&local_38);
  pcVar1 = GetDefinition(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return pcVar1;
}

Assistant:

const char* cmMakefile::GetSONameFlag(const std::string& language) const
{
  std::string name = "CMAKE_SHARED_LIBRARY_SONAME";
  if(!language.empty())
    {
    name += "_";
    name += language;
    }
  name += "_FLAG";
  return GetDefinition(name);
}